

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize)

{
  LinearSystemPimpl *pLVar1;
  MatrixDynSize *pMVar2;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  undefined1 local_49;
  TimeInvariantObject<iDynTree::MatrixDynSize> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  TimeInvariantObject<iDynTree::MatrixDynSize> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  DynamicalSystem::DynamicalSystem(&this->super_DynamicalSystem,stateSize,controlSize);
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_0019a810;
  pLVar1 = (LinearSystemPimpl *)operator_new(0xf8);
  memset(pLVar1,0,0xf8);
  SparsityStructure::SparsityStructure(&pLVar1->stateSparsity);
  SparsityStructure::SparsityStructure(&pLVar1->controlSparsity);
  this->m_pimpl = pLVar1;
  pLVar1->hasStateSparsity = false;
  pLVar1->hasControlSparsity = false;
  local_38 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>>
            (&local_30,&local_38,
             (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             &local_48);
  pMVar2 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_38);
  iDynTree::MatrixDynSize::resize((ulong)pMVar2,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_38);
  iDynTree::MatrixDynSize::zero();
  pLVar1 = this->m_pimpl;
  (pLVar1->stateMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_38->super_TimeVaryingObject<iDynTree::MatrixDynSize>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pLVar1->stateMatrix).
              super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_30);
  local_48 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>>
            (&local_40,&local_48,
             (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *)
             &local_49);
  pMVar2 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_48);
  iDynTree::MatrixDynSize::resize((ulong)pMVar2,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_48);
  iDynTree::MatrixDynSize::zero();
  pLVar1 = this->m_pimpl;
  (pLVar1->controlMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_48->super_TimeVaryingObject<iDynTree::MatrixDynSize>;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pLVar1->controlMatrix).
              super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_40);
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize,
                                   size_t controlSize)
        : DynamicalSystem(stateSize, controlSize)
        , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;
        }